

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-kv-cache.cpp
# Opt level: O2

llama_pos __thiscall
llama_kv_cache_unified::seq_pos_max(llama_kv_cache_unified *this,llama_seq_id seq_id)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  uint32_t i;
  ulong uVar4;
  long lVar5;
  llama_seq_id local_2c;
  
  lVar5 = 0;
  iVar3 = 0;
  local_2c = seq_id;
  for (uVar4 = 0; uVar4 < this->size; uVar4 = uVar4 + 1) {
    bVar2 = llama_kv_cell::has_seq_id
                      ((llama_kv_cell *)
                       ((long)&((this->cells).
                                super__Vector_base<llama_kv_cell,_std::allocator<llama_kv_cell>_>.
                                _M_impl.super__Vector_impl_data._M_start)->pos + lVar5),&local_2c);
    if ((bVar2) &&
       (iVar1 = *(int *)((long)&((this->cells).
                                 super__Vector_base<llama_kv_cell,_std::allocator<llama_kv_cell>_>.
                                 _M_impl.super__Vector_impl_data._M_start)->pos + lVar5),
       iVar3 <= iVar1)) {
      iVar3 = iVar1;
    }
    lVar5 = lVar5 + 0x40;
  }
  return iVar3;
}

Assistant:

llama_pos llama_kv_cache_unified::seq_pos_max(llama_seq_id seq_id) const {
    llama_pos result = 0;

    for (uint32_t i = 0; i < size; ++i) {
        if (cells[i].has_seq_id(seq_id)) {
            result = std::max(result, cells[i].pos);
        }
    }

    return result;
}